

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPExternalTransmitter::GetLocalHostName
          (RTPExternalTransmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  RTPMemoryManager *pRVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *__dest;
  ulong __n;
  char name [1024];
  char local_418 [1023];
  undefined1 local_19;
  
  iVar2 = -0x97;
  if (this->init == true) {
    iVar2 = -0x96;
    if (this->created == true) {
      if (this->localhostname == (uint8_t *)0x0) {
        iVar2 = gethostname(local_418,0x3ff);
        if (iVar2 == 0) {
          local_19 = 0;
        }
        else {
          builtin_strncpy(local_418,"localhost",10);
        }
        sVar3 = strlen(local_418);
        this->localhostnamelength = sVar3;
        pRVar1 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
        if (pRVar1 == (RTPMemoryManager *)0x0) {
          __dest = (uint8_t *)operator_new__(sVar3 + 1);
        }
        else {
          __dest = (uint8_t *)(**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,sVar3 + 1,0);
        }
        this->localhostname = __dest;
        memcpy(__dest,local_418,this->localhostnamelength);
        this->localhostname[this->localhostnamelength] = '\0';
      }
      __n = this->localhostnamelength;
      iVar2 = -0x45;
      if (__n <= *bufferlength) {
        memcpy(buffer,this->localhostname,__n);
        __n = this->localhostnamelength;
        iVar2 = 0;
      }
      *bufferlength = __n;
    }
  }
  return iVar2;
}

Assistant:

int RTPExternalTransmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!init)
		return ERR_RTP_EXTERNALTRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOTCREATED;
	}

	if (localhostname == 0)
	{
		// We'll just use 'gethostname' for simplicity

		char name[1024];

		if (gethostname(name,1023) != 0)
			strcpy(name, "localhost"); // failsafe
		else
			name[1023] = 0; // ensure null-termination

		localhostnamelength = strlen(name);
		localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];

		memcpy(localhostname, name, localhostnamelength);
		localhostname[localhostnamelength] = 0;
	}
	
	if ((*bufferlength) < localhostnamelength)
	{
		*bufferlength = localhostnamelength; // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,localhostname,localhostnamelength);
	*bufferlength = localhostnamelength;
	
	MAINMUTEX_UNLOCK
	return 0;
}